

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneProperties
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId srcTypeId,Src src,Dst dst)

{
  ScriptContext *requestContext;
  bool bVar1;
  int iVar2;
  RecyclableObject *pRVar3;
  JavascriptArray *arr;
  undefined1 auStack_a8 [8];
  JavascriptStaticEnumerator enumerator;
  ObjectPropertyEnumerator propEnumerator;
  
  pRVar3 = VarTo<Js::RecyclableObject>(src);
  auStack_a8 = (undefined1  [8])0x0;
  enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
  enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
  enumerator.propertyEnumerator.enumeratedCount = 0;
  enumerator.propertyEnumerator.flags = None;
  enumerator.propertyEnumerator._37_3_ = 0;
  enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
  enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
  enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
  JavascriptStaticEnumerator::Clear
            ((JavascriptStaticEnumerator *)auStack_a8,None,(ScriptContext *)0x0);
  requestContext =
       (this->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  bVar1 = DynamicObject::IsAnyArrayTypeId(srcTypeId);
  if (bVar1) {
    arr = JavascriptArray::FromAnyArray(src);
    bVar1 = IsSparseArray(arr);
    enumerator.arrayEnumerator.ptr._0_4_ = bVar1 + 0x32;
    StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&enumerator.arrayEnumerator);
    enumerator.arrayEnumerator.ptr._0_4_ = (arr->super_ArrayObject).length;
    StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&enumerator.arrayEnumerator);
    if (bVar1) {
      WriteSparseArrayIndexProperties(this,arr);
    }
    else {
      WriteDenseArrayIndexProperties(this,arr);
    }
    JavascriptArray::GetNonIndexEnumerator
              (arr,(JavascriptStaticEnumerator *)auStack_a8,requestContext);
  }
  else {
    iVar2 = (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x2b])(pRVar3,auStack_a8,4,requestContext,0);
    if (iVar2 == 0) {
      enumerator.arrayEnumerator.ptr._0_4_ = 0xffffffff;
      StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&enumerator.arrayEnumerator);
      return;
    }
  }
  enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)requestContext;
  WriteObjectProperties<Js::ObjectPropertyEnumerator>
            (this,(ObjectPropertyEnumerator *)&enumerator.arrayEnumerator);
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneProperties(SrcTypeId srcTypeId, Src src, Dst dst)
    {
        RecyclableObject* obj = VarTo<RecyclableObject>(src);
        // allocate the JavascriptStaticEnumerator on the heap to avoid blowing the stack
        JavascriptStaticEnumerator enumerator;
        ScriptContext* scriptContext = this->GetScriptContext();
        if (DynamicObject::IsAnyArrayTypeId(srcTypeId))
        {
            JavascriptArray* arr = JavascriptArray::FromAnyArray(src);
            bool isSparseArray = IsSparseArray(arr);

            WriteTypeId(isSparseArray ? SCA_SparseArray : SCA_DenseArray);
            Write(arr->GetLength());

            if (isSparseArray)
            {
                WriteSparseArrayIndexProperties(arr);
            }
            else
            {
                WriteDenseArrayIndexProperties(arr);
            }

            // Now we only need to write remaining non-index properties
            arr->GetNonIndexEnumerator(&enumerator, scriptContext);
        }
        else if (!obj->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics, scriptContext))
        {
            // Mark property end if we don't have enumerator
            m_writer->Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
            return;
        }

        ObjectPropertyEnumerator propEnumerator(scriptContext, obj, &enumerator);
        WriteObjectProperties(&propEnumerator);
    }